

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_create_files(uv_timer_t *handle)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (0xf < fs_event_created) {
    pcVar4 = "fs_event_created < fs_event_file_count";
    uVar3 = 0x9e;
LAB_0011a8e5:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,uVar3,pcVar4);
    abort();
  }
  fs_event_get_filename(fs_event_created);
  create_file(fs_event_filename);
  iVar2 = fs_event_created + 1;
  bVar1 = fs_event_created < 0xf;
  fs_event_created = iVar2;
  if (bVar1) {
    iVar2 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar2 != 0) {
      pcVar4 = "0 == uv_timer_start(&timer, fs_event_create_files, CREATE_TIMEOUT, 0)";
      uVar3 = 0xa9;
      goto LAB_0011a8e5;
    }
  }
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT(fs_event_created < fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT(0 == uv_timer_start(&timer,
                               fs_event_create_files,
                               CREATE_TIMEOUT,
                               0));
  }
}